

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool perfetto::internal::TrackEventInternal::Initialize
               (TrackEventCategoryRegistry *registry,
               _func_bool_DataSourceDescriptor_ptr *register_data_source)

{
  ScatteredStreamWriter *__s;
  MessageArena *__s_00;
  char *__s_01;
  Category *pCVar1;
  bool bVar2;
  byte bVar3;
  __int_type_conflict6 _Var4;
  PlatformThreadId __i;
  int iVar5;
  Category *pCVar6;
  TrackEventDescriptor *this;
  TrackEventCategory *pTVar7;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  const_iterator local_258;
  value_type *tag;
  const_iterator __end3;
  const_iterator __begin3;
  Tags *__range3;
  string local_230;
  allocator<char> local_209;
  string local_208;
  TrackEventCategory *local_1e8;
  TrackEventCategory *cat;
  Category *category;
  size_t i;
  HeapBuffered<perfetto::protos::pbzero::TrackEventDescriptor> ted;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  DataSourceDescriptor dsd;
  _func_bool_DataSourceDescriptor_ptr *register_data_source_local;
  TrackEventCategoryRegistry *registry_local;
  
  dsd._has_field_.super__Base_bitset<1UL>._M_w =
       (_Base_bitset<1UL>)(_Base_bitset<1UL>)register_data_source;
  _Var4 = ::std::__atomic_base::operator_cast_to_int
                    ((__atomic_base *)&(anonymous_namespace)::g_main_thread);
  if (_Var4 == 0) {
    __i = perfetto::base::GetThreadId();
    std::__atomic_base<int>::operator=
              ((__atomic_base<int> *)&(anonymous_namespace)::g_main_thread,__i);
  }
  protos::gen::DataSourceDescriptor::DataSourceDescriptor((DataSourceDescriptor *)local_d8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"track_event",&local_f9);
  protos::gen::DataSourceDescriptor::set_name((DataSourceDescriptor *)local_d8,&local_f8);
  ::std::__cxx11::string::~string((string *)&local_f8);
  ::std::allocator<char>::~allocator(&local_f9);
  protozero::HeapBuffered<perfetto::protos::pbzero::TrackEventDescriptor>::HeapBuffered
            ((HeapBuffered<perfetto::protos::pbzero::TrackEventDescriptor> *)&i);
  for (category = (Category *)0x0; pCVar1 = category,
      pCVar6 = (Category *)TrackEventCategoryRegistry::category_count(registry), pCVar1 < pCVar6;
      category = (Category *)((long)&category->name + 1)) {
    cat = (TrackEventCategory *)TrackEventCategoryRegistry::GetCategory(registry,(size_t)category);
    bVar2 = Category::IsGroup((Category *)cat);
    if (!bVar2) {
      this = protozero::HeapBuffered<perfetto::protos::pbzero::TrackEventDescriptor>::operator->
                       ((HeapBuffered<perfetto::protos::pbzero::TrackEventDescriptor> *)&i);
      pTVar7 = protos::pbzero::TrackEventDescriptor::
               add_available_categories<perfetto::protos::pbzero::TrackEventCategory>(this);
      __s = (cat->super_Message).stream_writer_;
      local_1e8 = pTVar7;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,(char *)__s,&local_209);
      protos::pbzero::TrackEventCategory::set_name(pTVar7,&local_208);
      ::std::__cxx11::string::~string((string *)&local_208);
      ::std::allocator<char>::~allocator(&local_209);
      pTVar7 = local_1e8;
      if ((cat->super_Message).arena_ != (MessageArena *)0x0) {
        __s_00 = (cat->super_Message).arena_;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_230,(char *)__s_00,(allocator<char> *)((long)&__range3 + 7));
        protos::pbzero::TrackEventCategory::set_description(pTVar7,&local_230);
        ::std::__cxx11::string::~string((string *)&local_230);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
      }
      __begin3 = (const_iterator)&(cat->super_Message).nested_message_;
      __end3 = std::array<const_char_*,_4UL>::begin((array<const_char_*,_4UL> *)__begin3);
      tag = std::array<const_char_*,_4UL>::end((array<const_char_*,_4UL> *)__begin3);
      for (; pTVar7 = local_1e8, __end3 != tag; __end3 = __end3 + 1) {
        local_258 = __end3;
        if (*__end3 != (value_type)0x0) {
          __s_01 = *__end3;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_278,__s_01,&local_279);
          protos::pbzero::TrackEventCategory::add_tags(pTVar7,&local_278);
          ::std::__cxx11::string::~string((string *)&local_278);
          ::std::allocator<char>::~allocator(&local_279);
        }
      }
      iVar5 = strncmp((char *)(cat->super_Message).stream_writer_,"disabled-by-default-",0x14);
      pTVar7 = local_1e8;
      if (iVar5 == 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"slow",&local_2a1)
        ;
        protos::pbzero::TrackEventCategory::add_tags(pTVar7,&local_2a0);
        ::std::__cxx11::string::~string((string *)&local_2a0);
        ::std::allocator<char>::~allocator(&local_2a1);
      }
    }
  }
  protozero::HeapBuffered<perfetto::protos::pbzero::TrackEventDescriptor>::
  SerializeAsString_abi_cxx11_
            (&local_2c8,(HeapBuffered<perfetto::protos::pbzero::TrackEventDescriptor> *)&i);
  protos::gen::DataSourceDescriptor::set_track_event_descriptor_raw
            ((DataSourceDescriptor *)local_d8,&local_2c8);
  ::std::__cxx11::string::~string((string *)&local_2c8);
  bVar3 = (*(code *)dsd._has_field_.super__Base_bitset<1UL>._M_w)(local_d8);
  protozero::HeapBuffered<perfetto::protos::pbzero::TrackEventDescriptor>::~HeapBuffered
            ((HeapBuffered<perfetto::protos::pbzero::TrackEventDescriptor> *)&i);
  protos::gen::DataSourceDescriptor::~DataSourceDescriptor((DataSourceDescriptor *)local_d8);
  return (bool)(bVar3 & 1);
}

Assistant:

bool TrackEventInternal::Initialize(
    const TrackEventCategoryRegistry& registry,
    bool (*register_data_source)(const DataSourceDescriptor&)) {
  if (!g_main_thread)
    g_main_thread = perfetto::base::GetThreadId();

  DataSourceDescriptor dsd;
  dsd.set_name("track_event");

  protozero::HeapBuffered<protos::pbzero::TrackEventDescriptor> ted;
  for (size_t i = 0; i < registry.category_count(); i++) {
    auto category = registry.GetCategory(i);
    // Don't register group categories.
    if (category->IsGroup())
      continue;
    auto cat = ted->add_available_categories();
    cat->set_name(category->name);
    if (category->description)
      cat->set_description(category->description);
    for (const auto& tag : category->tags) {
      if (tag)
        cat->add_tags(tag);
    }
    // Disabled-by-default categories get a "slow" tag.
    if (!strncmp(category->name, kLegacySlowPrefix, strlen(kLegacySlowPrefix)))
      cat->add_tags(kSlowTag);
  }
  dsd.set_track_event_descriptor_raw(ted.SerializeAsString());

  return register_data_source(dsd);
}